

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_Mesh::Append(ON_Mesh *this,int mesh_count,ON_Mesh **meshes)

{
  ON_Mesh *pOVar1;
  ON_MeshCurvatureStats *this_00;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  ON_MeshFace *pOVar13;
  ON_3fPoint *pOVar14;
  ON_MeshNgon *pOVar15;
  ON_3dPoint *buffer;
  ON_3fVector *pOVar16;
  ON_2fPoint *buffer_00;
  ON_2dPoint *buffer_01;
  ON_SurfaceCurvature *buffer_02;
  ON_Color *buffer_03;
  ON_TextureCoordinates *pOVar17;
  ON_TextureCoordinates *pOVar18;
  ON_MeshParameters *pOVar19;
  bool local_1eb;
  bool local_1ea;
  byte local_1e9;
  ON_Interval *local_1e8;
  ON_Interval *local_1e0;
  ON_Interval *local_1c8;
  bool local_1bb;
  bool local_1ba;
  bool local_1b9;
  ON_Interval *local_1b8;
  ON_Interval *local_1b0;
  ON_Interval *local_198;
  bool local_18b;
  bool local_18a;
  bool local_189;
  bool local_188;
  bool local_187;
  bool local_186;
  bool local_185;
  bool local_184;
  bool local_183;
  bool local_182;
  bool local_181;
  int local_178;
  int tcimi;
  bool bKeep;
  int tci;
  uint uStack_164;
  bool bAllowNewCachedTCs;
  uint nfi;
  uint nvi;
  ON_MeshNgon *ngon1;
  ON_MeshNgon *ngon0;
  uint ni;
  uint ngon_count;
  int fcount1_1;
  int vcount1_1;
  uint fcount0_local;
  uint vcount0_local;
  int fcount1;
  ON_SHA1_Hash this_mesh_mp_hash;
  ON_MeshParameters *this_mesh_mp;
  int vcount1;
  uint merged_count;
  int vcount;
  int fcount;
  double srf_scale [2];
  bool local_e9;
  undefined1 auStack_e8 [7];
  bool packed_tex_rotate;
  double local_e0;
  ON_Interval local_d8;
  undefined1 auStack_c8 [15];
  bool local_b9;
  undefined1 auStack_b8 [7];
  bool bHasTexturePackingDomain;
  double local_b0;
  ON_Interval local_a8;
  undefined1 auStack_98 [16];
  ON__UINT8 OStack_88;
  ON__UINT8 OStack_87;
  ON__UINT8 OStack_86;
  ON__UINT8 OStack_85;
  ON__UINT8 OStack_84;
  ON__UINT8 OStack_83;
  ON__UINT8 OStack_82;
  bool bHasSurfaceDomain;
  ON__UINT8 local_80;
  ON__UINT8 OStack_7f;
  ON__UINT8 OStack_7e;
  ON__UINT8 OStack_7d;
  ON__UINT8 OStack_7c;
  ON__UINT8 OStack_7b;
  ON__UINT8 OStack_7a;
  ON__UINT8 OStack_79;
  ON__UINT8 local_78;
  ON__UINT8 OStack_77;
  ON__UINT8 OStack_76;
  ON__UINT8 OStack_75;
  undefined1 local_74 [8];
  ON_SHA1_Hash mp_hash;
  ON_MeshParameters *mp;
  bool local_4f;
  bool local_4e;
  bool local_4d;
  bool local_4c;
  bool local_4b;
  bool local_4a;
  bool bSetMeshParameters;
  bool bHasNgonMap;
  bool bHasDoubles;
  bool bHasSurfaceParameters;
  bool bHasVertexColors;
  bool bHasPrincipalCurvatures;
  bool bHasTextureCoordinates;
  bool bHasFaceNormals;
  bool bHasVertexNormals;
  ON_Mesh *m;
  int j;
  int *vi;
  int fcount0;
  int vcount0;
  int mi;
  ON_Mesh **meshes_local;
  int mesh_count_local;
  ON_Mesh *this_local;
  
  if ((0 < mesh_count) && (meshes != (ON_Mesh **)0x0)) {
    iVar6 = VertexCount(this);
    if (iVar6 < 1) {
      ON_SimpleArray<ON_MeshFace>::SetCount(&this->m_F,0);
    }
    uVar7 = FaceCount(this);
    local_181 = true;
    if (iVar6 != 0) {
      local_181 = HasVertexNormals(this);
    }
    bSetMeshParameters = local_181;
    local_182 = true;
    if ((iVar6 != 0) && (local_182 = true, uVar7 != 0)) {
      local_182 = HasFaceNormals(this);
    }
    local_4a = local_182;
    local_183 = true;
    if (iVar6 != 0) {
      local_183 = HasTextureCoordinates(this);
    }
    local_4b = local_183;
    local_184 = true;
    if (iVar6 != 0) {
      local_184 = HasPrincipalCurvatures(this);
    }
    local_4c = local_184;
    local_185 = true;
    if (iVar6 != 0) {
      local_185 = HasVertexColors(this);
    }
    local_4d = local_185;
    local_186 = true;
    if (iVar6 != 0) {
      local_186 = HasSurfaceParameters(this);
    }
    local_4e = local_186;
    local_187 = true;
    if (iVar6 != 0) {
      local_187 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
    }
    local_4f = local_187;
    iVar8 = NgonCount(this);
    local_188 = false;
    if (0 < iVar8) {
      puVar12 = NgonMap(this);
      local_188 = puVar12 != (uint *)0x0;
    }
    mp._7_1_ = true;
    mp_hash.m_digest[0xc] = '\0';
    mp_hash.m_digest[0xd] = '\0';
    mp_hash.m_digest[0xe] = '\0';
    mp_hash.m_digest[0xf] = '\0';
    mp_hash.m_digest[0x10] = '\0';
    mp_hash.m_digest[0x11] = '\0';
    mp_hash.m_digest[0x12] = '\0';
    mp_hash.m_digest[0x13] = '\0';
    local_74[0] = ON_SHA1_Hash::EmptyContentHash.m_digest[0];
    local_74[1] = ON_SHA1_Hash::EmptyContentHash.m_digest[1];
    local_74[2] = ON_SHA1_Hash::EmptyContentHash.m_digest[2];
    local_74[3] = ON_SHA1_Hash::EmptyContentHash.m_digest[3];
    local_74[4] = ON_SHA1_Hash::EmptyContentHash.m_digest[4];
    local_74[5] = ON_SHA1_Hash::EmptyContentHash.m_digest[5];
    local_74[6] = ON_SHA1_Hash::EmptyContentHash.m_digest[6];
    local_74[7] = ON_SHA1_Hash::EmptyContentHash.m_digest[7];
    mp_hash.m_digest[0] = ON_SHA1_Hash::EmptyContentHash.m_digest[8];
    mp_hash.m_digest[1] = ON_SHA1_Hash::EmptyContentHash.m_digest[9];
    mp_hash.m_digest[2] = ON_SHA1_Hash::EmptyContentHash.m_digest[10];
    mp_hash.m_digest[3] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xb];
    mp_hash.m_digest[4] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xc];
    mp_hash.m_digest[5] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xd];
    mp_hash.m_digest[6] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xe];
    mp_hash.m_digest[7] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xf];
    mp_hash.m_digest[8] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x10];
    mp_hash.m_digest[9] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x11];
    mp_hash.m_digest[10] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x12];
    mp_hash.m_digest[0xb] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x13];
    if (iVar6 != 0) {
      mp_hash.m_digest._12_8_ = MeshParameters(this);
      mp._7_1_ = (ON_MeshParameters *)mp_hash.m_digest._12_8_ != (ON_MeshParameters *)0x0;
      if (mp._7_1_) {
        ON_MeshParameters::GeometrySettingsHash
                  ((ON_SHA1_Hash *)&stack0xffffffffffffff78,
                   (ON_MeshParameters *)mp_hash.m_digest._12_8_);
        local_74[0] = OStack_88;
        local_74[1] = OStack_87;
        local_74[2] = OStack_86;
        local_74[3] = OStack_85;
        local_74[4] = OStack_84;
        local_74[5] = OStack_83;
        local_74[6] = OStack_82;
        local_74[7] = bHasSurfaceDomain;
        mp_hash.m_digest[0] = local_80;
        mp_hash.m_digest[1] = OStack_7f;
        mp_hash.m_digest[2] = OStack_7e;
        mp_hash.m_digest[3] = OStack_7d;
        mp_hash.m_digest[4] = OStack_7c;
        mp_hash.m_digest[5] = OStack_7b;
        mp_hash.m_digest[6] = OStack_7a;
        mp_hash.m_digest[7] = OStack_79;
        mp_hash.m_digest[8] = local_78;
        mp_hash.m_digest[9] = OStack_77;
        mp_hash.m_digest[10] = OStack_76;
        mp_hash.m_digest[0xb] = OStack_75;
      }
    }
    local_189 = false;
    if (local_186 != false) {
      local_18a = true;
      if (iVar6 != 0) {
        bVar4 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x240);
        local_18b = false;
        if (bVar4) {
          local_18b = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x250);
        }
        local_18a = local_18b;
      }
      local_189 = local_18a;
    }
    auStack_98[0xf] = local_189;
    local_198 = (ON_Interval *)auStack_b8;
    do {
      ON_Interval::ON_Interval(local_198);
      local_198 = local_198 + 1;
    } while (local_198 != (ON_Interval *)auStack_98);
    if (((auStack_98[0xf] & 1) == 0) || (iVar6 < 1)) {
      local_1b0 = &ON_Interval::EmptyInterval;
    }
    else {
      local_1b0 = (ON_Interval *)&this->field_0x240;
    }
    _auStack_b8 = local_1b0->m_t[0];
    local_b0 = local_1b0->m_t[1];
    if (((auStack_98[0xf] & 1) == 0) || (iVar6 < 1)) {
      local_1b8 = &ON_Interval::EmptyInterval;
    }
    else {
      local_1b8 = (ON_Interval *)&this->field_0x250;
    }
    local_a8.m_t[0] = local_1b8->m_t[0];
    local_a8.m_t[1] = local_1b8->m_t[1];
    local_1b9 = false;
    if (local_183 != false) {
      local_1ba = true;
      if (iVar6 != 0) {
        bVar4 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x270);
        local_1bb = false;
        if (bVar4) {
          local_1bb = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x280);
        }
        local_1ba = local_1bb;
      }
      local_1b9 = local_1ba;
    }
    local_b9 = local_1b9;
    local_1c8 = (ON_Interval *)auStack_e8;
    do {
      ON_Interval::ON_Interval(local_1c8);
      local_1c8 = local_1c8 + 1;
    } while (local_1c8 != (ON_Interval *)auStack_c8);
    if (((local_b9 & 1U) == 0) || (iVar6 < 1)) {
      local_1e0 = &ON_Interval::EmptyInterval;
    }
    else {
      local_1e0 = (ON_Interval *)&this->field_0x270;
    }
    _auStack_e8 = local_1e0->m_t[0];
    local_e0 = local_1e0->m_t[1];
    if (((local_b9 & 1U) == 0) || (iVar6 < 1)) {
      local_1e8 = &ON_Interval::EmptyInterval;
    }
    else {
      local_1e8 = (ON_Interval *)&this->field_0x280;
    }
    local_d8.m_t[0] = local_1e8->m_t[0];
    local_d8.m_t[1] = local_1e8->m_t[1];
    local_1e9 = 0;
    if ((local_b9 & 1U) != 0) {
      local_1e9 = this->m_packed_tex_rotate;
    }
    local_e9 = (bool)(-(local_1e9 & 1) & 1);
    _vcount = this->m_srf_scale[0];
    srf_scale[0] = this->m_srf_scale[1];
    this_mesh_mp._4_4_ = (uint)(0 < iVar6);
    vcount1 = iVar6;
    merged_count = uVar7;
    for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
      pOVar1 = meshes[fcount0];
      if ((pOVar1 != (ON_Mesh *)0x0) &&
         (iVar8 = ON_SimpleArray<ON_3fPoint>::Count(&(pOVar1->m_V).super_ON_SimpleArray<ON_3fPoint>)
         , 0 < iVar8)) {
        this_mesh_mp._4_4_ = this_mesh_mp._4_4_ + 1;
        if (mp._7_1_) {
          this_mesh_mp_hash.m_digest._12_8_ = MeshParameters(pOVar1);
          if ((ON_MeshParameters *)this_mesh_mp_hash.m_digest._12_8_ == (ON_MeshParameters *)0x0) {
            mp._7_1_ = false;
          }
          else {
            ON_MeshParameters::GeometrySettingsHash
                      ((ON_SHA1_Hash *)&vcount0_local,
                       (ON_MeshParameters *)this_mesh_mp_hash.m_digest._12_8_);
            if (mp_hash.m_digest._12_8_ == 0) {
              mp_hash.m_digest[0xc] = this_mesh_mp_hash.m_digest[0xc];
              mp_hash.m_digest[0xd] = this_mesh_mp_hash.m_digest[0xd];
              mp_hash.m_digest[0xe] = this_mesh_mp_hash.m_digest[0xe];
              mp_hash.m_digest[0xf] = this_mesh_mp_hash.m_digest[0xf];
              mp_hash.m_digest[0x10] = this_mesh_mp_hash.m_digest[0x10];
              mp_hash.m_digest[0x11] = this_mesh_mp_hash.m_digest[0x11];
              mp_hash.m_digest[0x12] = this_mesh_mp_hash.m_digest[0x12];
              mp_hash.m_digest[0x13] = this_mesh_mp_hash.m_digest[0x13];
              local_74[0] = (ON__UINT8)vcount0_local;
              local_74[1] = vcount0_local._1_1_;
              local_74[2] = vcount0_local._2_1_;
              local_74[3] = vcount0_local._3_1_;
              local_74[4] = (ON__UINT8)fcount1;
              local_74[5] = fcount1._1_1_;
              local_74[6] = fcount1._2_1_;
              local_74[7] = fcount1._3_1_;
              mp_hash.m_digest[0] = this_mesh_mp_hash.m_digest[0];
              mp_hash.m_digest[1] = this_mesh_mp_hash.m_digest[1];
              mp_hash.m_digest[2] = this_mesh_mp_hash.m_digest[2];
              mp_hash.m_digest[3] = this_mesh_mp_hash.m_digest[3];
              mp_hash.m_digest[4] = this_mesh_mp_hash.m_digest[4];
              mp_hash.m_digest[5] = this_mesh_mp_hash.m_digest[5];
              mp_hash.m_digest[6] = this_mesh_mp_hash.m_digest[6];
              mp_hash.m_digest[7] = this_mesh_mp_hash.m_digest[7];
              mp_hash.m_digest[8] = this_mesh_mp_hash.m_digest[8];
              mp_hash.m_digest[9] = this_mesh_mp_hash.m_digest[9];
              mp_hash.m_digest[10] = this_mesh_mp_hash.m_digest[10];
              mp_hash.m_digest[0xb] = this_mesh_mp_hash.m_digest[0xb];
            }
            else {
              bVar4 = ::operator!=((ON_SHA1_Hash *)&vcount0_local,(ON_SHA1_Hash *)local_74);
              if (bVar4) {
                mp._7_1_ = false;
              }
            }
          }
        }
        iVar9 = ON_SimpleArray<ON_MeshFace>::Count(&pOVar1->m_F);
        if (0 < iVar9) {
          merged_count = iVar9 + merged_count;
        }
        vcount1 = iVar8 + vcount1;
        if ((bSetMeshParameters != false) && (bVar4 = HasVertexNormals(pOVar1), !bVar4)) {
          bSetMeshParameters = false;
        }
        if ((local_4b != false) && (bVar4 = HasTextureCoordinates(pOVar1), !bVar4)) {
          local_4b = false;
        }
        if ((local_4c != false) && (bVar4 = HasPrincipalCurvatures(pOVar1), !bVar4)) {
          local_4c = false;
        }
        if ((local_4d != false) && (bVar4 = HasVertexColors(pOVar1), !bVar4)) {
          local_4d = false;
        }
        if ((local_4e != false) && (bVar4 = HasSurfaceParameters(pOVar1), !bVar4)) {
          local_4e = false;
        }
        if ((local_4f != false) &&
           (bVar4 = HasSynchronizedDoubleAndSinglePrecisionVertices(pOVar1), !bVar4)) {
          local_4f = false;
        }
        if (((local_4a != false) && (0 < iVar9)) && (bVar4 = HasFaceNormals(pOVar1), !bVar4)) {
          local_4a = false;
        }
        if ((auStack_98[0xf] & 1) != 0) {
          local_1ea = false;
          if (local_4e != false) {
            bVar4 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar1->field_0x240);
            local_1ea = false;
            if (bVar4) {
              local_1ea = ON_Interval::IsIncreasing((ON_Interval *)&pOVar1->field_0x250);
            }
          }
          auStack_98[0xf] = local_1ea;
          if (local_1ea != false) {
            ON_Interval::Union((ON_Interval *)auStack_b8,(ON_Interval *)&pOVar1->field_0x240);
            ON_Interval::Union(&local_a8,(ON_Interval *)&pOVar1->field_0x250);
          }
        }
        if (((this_mesh_mp._4_4_ == 1) && (local_4e != false)) && ((auStack_98[0xf] & 1) != 0)) {
          _vcount = pOVar1->m_srf_scale[0];
          srf_scale[0] = pOVar1->m_srf_scale[1];
        }
        else {
          _vcount = 0.0;
          srf_scale[0] = 0.0;
        }
        if ((local_b9 & 1U) != 0) {
          local_1eb = false;
          if (local_4b != false) {
            bVar4 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar1->field_0x270);
            local_1eb = false;
            if (bVar4) {
              local_1eb = ON_Interval::IsIncreasing((ON_Interval *)&pOVar1->field_0x280);
            }
          }
          local_b9 = local_1eb;
          if (local_e9 != (bool)(-(pOVar1->m_packed_tex_rotate & 1U) & 1)) {
            if ((iVar6 == 0) && (fcount0 == 0)) {
              local_e9 = (bool)(-(pOVar1->m_packed_tex_rotate & 1U) & 1);
            }
            else {
              local_b9 = false;
            }
          }
          if (local_b9 != false) {
            if (this_mesh_mp._4_4_ == 1) {
              local_e9 = (bool)(-(pOVar1->m_packed_tex_rotate & 1U) & 1);
            }
            else if (local_e9 != (bool)(-(pOVar1->m_packed_tex_rotate & 1U) & 1)) {
              local_b9 = false;
            }
            ON_Interval::Union((ON_Interval *)auStack_e8,(ON_Interval *)&pOVar1->field_0x270);
            ON_Interval::Union(&local_d8,(ON_Interval *)&pOVar1->field_0x280);
          }
        }
      }
    }
    if ((iVar6 < vcount1) || ((int)uVar7 < (int)merged_count)) {
      if ((local_4e == false) || ((auStack_98[0xf] & 1) == 0)) {
        _auStack_b8 = ON_Interval::EmptyInterval.m_t[0];
        local_b0 = ON_Interval::EmptyInterval.m_t[1];
        local_a8.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
        local_a8.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
        _vcount = 0.0;
        srf_scale[0] = 0.0;
      }
      if ((local_4b == false) || ((local_b9 & 1U) == 0)) {
        _auStack_e8 = ON_Interval::EmptyInterval.m_t[0];
        local_e0 = ON_Interval::EmptyInterval.m_t[1];
        local_d8.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
        local_d8.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
        local_e9 = false;
      }
      *(double *)&this->field_0x240 = _auStack_b8;
      *(double *)&this->field_0x248 = local_b0;
      *(double *)&this->field_0x250 = local_a8.m_t[0];
      *(double *)&this->field_0x258 = local_a8.m_t[1];
      this->m_srf_scale[0] = _vcount;
      this->m_srf_scale[1] = srf_scale[0];
      *(double *)&this->field_0x270 = _auStack_e8;
      *(double *)&this->field_0x278 = local_e0;
      *(double *)&this->field_0x280 = local_d8.m_t[0];
      *(double *)&this->field_0x288 = local_d8.m_t[1];
      this->m_packed_tex_rotate = local_e9;
      ON_MeshTopology::Destroy(&this->m_top);
      ON_SimpleArray<ON_3fPoint>::Reserve
                (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,(long)vcount1);
      ON_SimpleArray<ON_MeshFace>::Reserve(&this->m_F,(long)(int)merged_count);
      for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
        uVar7 = ON_SimpleArray<ON_3fPoint>::UnsignedCount
                          (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
        uVar10 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&this->m_F);
        pOVar1 = meshes[fcount0];
        if ((pOVar1 != (ON_Mesh *)0x0) &&
           (iVar8 = ON_SimpleArray<ON_3fPoint>::Count
                              (&(pOVar1->m_V).super_ON_SimpleArray<ON_3fPoint>), 0 < iVar8)) {
          iVar9 = ON_SimpleArray<ON_MeshFace>::Count(&pOVar1->m_F);
          if (0 < iVar9) {
            m._4_4_ = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F);
            pOVar13 = ON_SimpleArray<ON_MeshFace>::Array(&pOVar1->m_F);
            ON_SimpleArray<ON_MeshFace>::Append(&this->m_F,iVar9,pOVar13);
            iVar9 = m._4_4_ + iVar9;
            for (; m._4_4_ < iVar9; m._4_4_ = m._4_4_ + 1) {
              pOVar13 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,m._4_4_);
              pOVar13->vi[0] = uVar7 + pOVar13->vi[0];
              pOVar13->vi[1] = uVar7 + pOVar13->vi[1];
              pOVar13->vi[2] = uVar7 + pOVar13->vi[2];
              pOVar13->vi[3] = uVar7 + pOVar13->vi[3];
            }
          }
          pOVar14 = ON_SimpleArray<ON_3fPoint>::Array
                              (&(pOVar1->m_V).super_ON_SimpleArray<ON_3fPoint>);
          ON_SimpleArray<ON_3fPoint>::Append
                    (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,iVar8,pOVar14);
          bVar4 = HasNgons(pOVar1);
          if (bVar4) {
            puVar12 = NgonMap(pOVar1);
            if (puVar12 != (uint *)0x0) {
              local_188 = true;
            }
            ON_SimpleArray<unsigned_int>::Destroy(&this->m_NgonMap);
            uVar11 = NgonUnsignedCount(pOVar1);
            for (ngon0._0_4_ = 0; (uint)ngon0 < uVar11; ngon0._0_4_ = (uint)ngon0 + 1) {
              pOVar15 = Ngon(pOVar1,(uint)ngon0);
              if ((pOVar15 != (ON_MeshNgon *)0x0) &&
                 (((pOVar15->m_Vcount != 0 || (pOVar15->m_Fcount != 0)) &&
                  (pOVar15 = ON_MeshNgonAllocator::CopyNgon(&this->m_NgonAllocator,pOVar15),
                  pOVar15 != (ON_MeshNgon *)0x0)))) {
                for (uStack_164 = 0; uStack_164 < pOVar15->m_Vcount; uStack_164 = uStack_164 + 1) {
                  pOVar15->m_vi[uStack_164] = uVar7 + pOVar15->m_vi[uStack_164];
                }
                for (tci = 0; (uint)tci < pOVar15->m_Fcount; tci = tci + 1) {
                  pOVar15->m_fi[(uint)tci] = uVar10 + pOVar15->m_fi[(uint)tci];
                }
                AddNgon(this,pOVar15);
              }
            }
          }
        }
      }
      if (local_4f != false) {
        ON_SimpleArray<ON_3dPoint>::Reserve
                  (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,(long)vcount1);
        for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
          pOVar1 = meshes[fcount0];
          if ((pOVar1 != (ON_Mesh *)0x0) &&
             (iVar8 = ON_SimpleArray<ON_3dPoint>::Count
                                (&(pOVar1->m_dV).super_ON_SimpleArray<ON_3dPoint>), 0 < iVar8)) {
            iVar8 = ON_SimpleArray<ON_3dPoint>::Count
                              (&(pOVar1->m_dV).super_ON_SimpleArray<ON_3dPoint>);
            buffer = ON_SimpleArray<ON_3dPoint>::Array
                               (&(pOVar1->m_dV).super_ON_SimpleArray<ON_3dPoint>);
            ON_SimpleArray<ON_3dPoint>::Append
                      (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,iVar8,buffer);
          }
        }
        iVar8 = ON_SimpleArray<ON_3dPoint>::Count(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
        if (iVar8 != vcount1) {
          local_4f = false;
        }
      }
      if (local_4f == false) {
        DestroyDoublePrecisionVertices(this);
      }
      if (bSetMeshParameters == false) {
        ON_SimpleArray<ON_3fVector>::Destroy(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
      }
      else {
        ON_SimpleArray<ON_3fVector>::Reserve
                  (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,(long)vcount1);
        for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
          pOVar1 = meshes[fcount0];
          if (pOVar1 != (ON_Mesh *)0x0) {
            iVar8 = ON_SimpleArray<ON_3fVector>::Count
                              (&(pOVar1->m_N).super_ON_SimpleArray<ON_3fVector>);
            pOVar16 = ON_SimpleArray<ON_3fVector>::Array
                                (&(pOVar1->m_N).super_ON_SimpleArray<ON_3fVector>);
            ON_SimpleArray<ON_3fVector>::Append
                      (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,iVar8,pOVar16);
          }
        }
      }
      if (local_4a == false) {
        ON_SimpleArray<ON_3fVector>::Destroy(&(this->m_FN).super_ON_SimpleArray<ON_3fVector>);
      }
      else {
        ON_SimpleArray<ON_3fVector>::Reserve
                  (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>,(long)(int)merged_count);
        for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
          pOVar1 = meshes[fcount0];
          if ((pOVar1 != (ON_Mesh *)0x0) &&
             (iVar8 = ON_SimpleArray<ON_3fPoint>::Count
                                (&(pOVar1->m_V).super_ON_SimpleArray<ON_3fPoint>), 0 < iVar8)) {
            iVar8 = ON_SimpleArray<ON_3fVector>::Count
                              (&(pOVar1->m_FN).super_ON_SimpleArray<ON_3fVector>);
            pOVar16 = ON_SimpleArray<ON_3fVector>::Array
                                (&(pOVar1->m_FN).super_ON_SimpleArray<ON_3fVector>);
            ON_SimpleArray<ON_3fVector>::Append
                      (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>,iVar8,pOVar16);
          }
        }
      }
      if (local_4b == false) {
        ON_SimpleArray<ON_2fPoint>::Destroy(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
      }
      else {
        ON_SimpleArray<ON_2fPoint>::Reserve
                  (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,(long)vcount1);
        for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
          pOVar1 = meshes[fcount0];
          if (pOVar1 != (ON_Mesh *)0x0) {
            iVar8 = ON_SimpleArray<ON_2fPoint>::Count
                              (&(pOVar1->m_T).super_ON_SimpleArray<ON_2fPoint>);
            buffer_00 = ON_SimpleArray<ON_2fPoint>::Array
                                  (&(pOVar1->m_T).super_ON_SimpleArray<ON_2fPoint>);
            ON_SimpleArray<ON_2fPoint>::Append
                      (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,iVar8,buffer_00);
          }
        }
      }
      if (local_4e == false) {
        ON_SimpleArray<ON_2dPoint>::Destroy(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
      }
      else {
        ON_SimpleArray<ON_2dPoint>::Reserve
                  (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)vcount1);
        for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
          pOVar1 = meshes[fcount0];
          if (pOVar1 != (ON_Mesh *)0x0) {
            iVar8 = ON_SimpleArray<ON_2dPoint>::Count
                              (&(pOVar1->m_S).super_ON_SimpleArray<ON_2dPoint>);
            buffer_01 = ON_SimpleArray<ON_2dPoint>::Array
                                  (&(pOVar1->m_S).super_ON_SimpleArray<ON_2dPoint>);
            ON_SimpleArray<ON_2dPoint>::Append
                      (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,iVar8,buffer_01);
          }
        }
      }
      if (local_4c == false) {
        ON_SimpleArray<ON_SurfaceCurvature>::Destroy(&this->m_K);
      }
      else {
        ON_SimpleArray<ON_SurfaceCurvature>::Reserve(&this->m_K,(long)vcount1);
        for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
          pOVar1 = meshes[fcount0];
          if (pOVar1 != (ON_Mesh *)0x0) {
            iVar8 = ON_SimpleArray<ON_SurfaceCurvature>::Count(&pOVar1->m_K);
            buffer_02 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&pOVar1->m_K);
            ON_SimpleArray<ON_SurfaceCurvature>::Append(&this->m_K,iVar8,buffer_02);
          }
        }
      }
      if (local_4d == false) {
        ON_SimpleArray<ON_Color>::Destroy(&this->m_C);
      }
      else {
        ON_SimpleArray<ON_Color>::Reserve(&this->m_C,(long)vcount1);
        for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
          pOVar1 = meshes[fcount0];
          if (pOVar1 != (ON_Mesh *)0x0) {
            iVar8 = ON_SimpleArray<ON_Color>::Count(&pOVar1->m_C);
            buffer_03 = ON_SimpleArray<ON_Color>::Array(&pOVar1->m_C);
            ON_SimpleArray<ON_Color>::Append(&this->m_C,iVar8,buffer_03);
          }
        }
      }
      if (this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
        for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
          pOVar1 = meshes[fcount0];
          if ((pOVar1 != (ON_Mesh *)0x0) &&
             ((pOVar1->m_mesh_parameters == (ON_MeshParameters *)0x0 ||
              (bVar4 = ::operator!=(this->m_mesh_parameters,pOVar1->m_mesh_parameters), bVar4)))) {
            if (this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
              operator_delete(this->m_mesh_parameters,0xe0);
            }
            this->m_mesh_parameters = (ON_MeshParameters *)0x0;
            break;
          }
        }
      }
      for (m._4_4_ = 0; m._4_4_ < 4; m._4_4_ = m._4_4_ + 1) {
        if (this->m_kstat[m._4_4_] != (ON_MeshCurvatureStats *)0x0) {
          this_00 = this->m_kstat[m._4_4_];
          if (this_00 != (ON_MeshCurvatureStats *)0x0) {
            ON_MeshCurvatureStats::~ON_MeshCurvatureStats(this_00);
            operator_delete(this_00,0x40);
          }
          this->m_kstat[m._4_4_] = (ON_MeshCurvatureStats *)0x0;
        }
      }
      bVar4 = iVar6 == 0;
      for (fcount0 = 0; fcount0 < mesh_count; fcount0 = fcount0 + 1) {
        pOVar1 = meshes[fcount0];
        if (pOVar1 != (ON_Mesh *)0x0) {
          if (bVar4) {
            ON_ClassArray<ON_TextureCoordinates>::operator=(&this->m_TC,&pOVar1->m_TC);
            bVar4 = false;
          }
          else {
            for (tcimi = 0; iVar6 = ON_ClassArray<ON_TextureCoordinates>::Count(&this->m_TC),
                tcimi < iVar6; tcimi = tcimi + 1) {
              bVar2 = false;
              for (local_178 = 0; iVar6 = ON_ClassArray<ON_TextureCoordinates>::Count(&pOVar1->m_TC)
                  , local_178 < iVar6; local_178 = local_178 + 1) {
                pOVar17 = ON_ClassArray<ON_TextureCoordinates>::operator[](&this->m_TC,tcimi);
                pOVar18 = ON_ClassArray<ON_TextureCoordinates>::operator[](&pOVar1->m_TC,local_178);
                bVar5 = ::operator==(&pOVar17->m_tag,&pOVar18->m_tag);
                if (bVar5) {
                  pOVar17 = ON_ClassArray<ON_TextureCoordinates>::operator[](&this->m_TC,tcimi);
                  pOVar18 = ON_ClassArray<ON_TextureCoordinates>::operator[]
                                      (&pOVar1->m_TC,local_178);
                  iVar6 = ON_SimpleArray<ON_3fPoint>::Count(&pOVar18->m_T);
                  pOVar18 = ON_ClassArray<ON_TextureCoordinates>::operator[]
                                      (&pOVar1->m_TC,local_178);
                  pOVar14 = ON_SimpleArray<ON_3fPoint>::Array(&pOVar18->m_T);
                  ON_SimpleArray<ON_3fPoint>::Append(&pOVar17->m_T,iVar6,pOVar14);
                  bVar2 = true;
                }
              }
              if (!bVar2) {
                ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,tcimi);
                tcimi = tcimi + -1;
              }
            }
          }
        }
      }
      SetClosed(this,-99);
      SetSolidOrientation(this,-99);
      InvalidateBoundingBoxes(this);
      iVar6 = NgonCount(this);
      if ((0 < iVar6) && (local_188)) {
        CreateNgonMap(this);
      }
      uVar3 = mp_hash.m_digest._12_8_;
      if (((mp._7_1_) && (mp_hash.m_digest._12_8_ != 0)) &&
         (pOVar19 = MeshParameters(this), (ON_MeshParameters *)uVar3 != pOVar19)) {
        SetMeshParameters(this,(ON_MeshParameters *)mp_hash.m_digest._12_8_);
      }
    }
  }
  return;
}

Assistant:

void ON_Mesh::Append(int mesh_count, const ON_Mesh* const* meshes)
{
  if (mesh_count <= 0 || 0 == meshes)
    return;

  int mi;
  int vcount0 = VertexCount();
  if (vcount0 <= 0)
    m_F.SetCount(0);
  int fcount0 = FaceCount();
  int* vi;
  int j;
  const ON_Mesh* m;

  // The calls to Has*() must happen before the m_V[] and m_F[] arrays get enlarged
  // Allow the appendage of VertexNormals, TextureCoordinates, PrincipalCurvatures to empty meshes
  // by checking for 0 == vcount0 && 0 == fcount0
  bool bHasVertexNormals = (0 == vcount0 || HasVertexNormals());
  bool bHasFaceNormals = (0 == vcount0 || 0 == fcount0 || HasFaceNormals());
  bool bHasTextureCoordinates = (0 == vcount0 || HasTextureCoordinates());
  bool bHasPrincipalCurvatures = (0 == vcount0 || HasPrincipalCurvatures());
  bool bHasVertexColors = (0 == vcount0 || HasVertexColors());
  bool bHasSurfaceParameters = (0 == vcount0 || HasSurfaceParameters());
  bool bHasDoubles = (0 == vcount0 || HasSynchronizedDoubleAndSinglePrecisionVertices());
  bool bHasNgonMap = (NgonCount() > 0 && 0 != NgonMap());

  bool bSetMeshParameters = true;
  const ON_MeshParameters* mp = nullptr;
  ON_SHA1_Hash mp_hash = ON_SHA1_Hash::EmptyContentHash;
  if (0 != vcount0)
  {
    mp = this->MeshParameters();
    if (nullptr == mp)
      bSetMeshParameters = false;
    else
      mp_hash = mp->GeometrySettingsHash();
  }

  bool bHasSurfaceDomain
    = bHasSurfaceParameters
    && (0 == vcount0 || (m_srf_domain[0].IsIncreasing() && m_srf_domain[1].IsIncreasing()));

  ON_Interval srf_domain[2];
  srf_domain[0] = (bHasSurfaceDomain && vcount0 > 0) ? m_srf_domain[0] : ON_Interval::EmptyInterval;
  srf_domain[1] = (bHasSurfaceDomain && vcount0 > 0) ? m_srf_domain[1] : ON_Interval::EmptyInterval;

  bool bHasTexturePackingDomain
    = bHasTextureCoordinates
    && (0 == vcount0 || (m_packed_tex_domain[0].IsIncreasing() && m_packed_tex_domain[1].IsIncreasing()));

  ON_Interval packed_tex_domain[2];
  packed_tex_domain[0] = (bHasTexturePackingDomain && vcount0 > 0) ? m_packed_tex_domain[0] : ON_Interval::EmptyInterval;
  packed_tex_domain[1] = (bHasTexturePackingDomain && vcount0 > 0) ? m_packed_tex_domain[1] : ON_Interval::EmptyInterval;
  bool packed_tex_rotate = (bHasTexturePackingDomain && m_packed_tex_rotate) ? true : false;

  double srf_scale[2] = { m_srf_scale[0], m_srf_scale[1] };

  int fcount = fcount0;
  int vcount = vcount0;
  unsigned int merged_count = vcount0 > 0 ? 1 : 0;
  for (mi = 0; mi < mesh_count; mi++)
  {
    m = meshes[mi];
    if (0 == m)
      continue;
    int vcount1 = m->m_V.Count();
    if (vcount1 <= 0)
      continue;

    merged_count++;

    if (bSetMeshParameters)
    {
      const ON_MeshParameters* this_mesh_mp = m->MeshParameters();
      if (nullptr == this_mesh_mp)
        bSetMeshParameters = false;
      else
      {
        const ON_SHA1_Hash this_mesh_mp_hash = this_mesh_mp->GeometrySettingsHash();
        if (nullptr == mp)
        {
          // first mesh parameters.
          mp = this_mesh_mp;
          mp_hash = this_mesh_mp_hash;
        }
        else
        {
          if (this_mesh_mp_hash != mp_hash)
          {
            // variable mesh paramters - means output gets none.
            bSetMeshParameters = false;
          }
        }
      }
    }

    int fcount1 = m->m_F.Count();
    if (fcount1 > 0)
      fcount += fcount1;
    vcount += vcount1;
    if (bHasVertexNormals && !m->HasVertexNormals())
      bHasVertexNormals = false;
    if (bHasTextureCoordinates && !m->HasTextureCoordinates())
      bHasTextureCoordinates = false;
    if (bHasPrincipalCurvatures && !m->HasPrincipalCurvatures())
      bHasPrincipalCurvatures = false;
    if (bHasVertexColors && !m->HasVertexColors())
      bHasVertexColors = false;
    if (bHasSurfaceParameters && !m->HasSurfaceParameters())
      bHasSurfaceParameters = false;
    if (bHasDoubles && !m->HasSynchronizedDoubleAndSinglePrecisionVertices())
      bHasDoubles = false;
    if (bHasFaceNormals && fcount1 > 0 && !m->HasFaceNormals())
      bHasFaceNormals = false;

    if (bHasSurfaceDomain)
    {
      bHasSurfaceDomain
        = bHasSurfaceParameters
        && m->m_srf_domain[0].IsIncreasing()
        && m->m_srf_domain[1].IsIncreasing();
      if (bHasSurfaceDomain)
      {
        srf_domain[0].Union(m->m_srf_domain[0]);
        srf_domain[1].Union(m->m_srf_domain[1]);
      }
    }

    if (1 == merged_count && bHasSurfaceParameters && bHasSurfaceDomain)
    {
      srf_scale[0] = m->m_srf_scale[0];
      srf_scale[1] = m->m_srf_scale[1];
    }
    else
    {
      srf_scale[0] = 0.0;
      srf_scale[1] = 0.0;
    }

    if (bHasTexturePackingDomain)
    {
      // 2014-04-01 Dale Lear
      //   Trying to merger packed_tex_domain[] intervals
      //   is questionable at best.
      //   A strong argument can be made for simply deleting
      //   packed texture domain information when there are
      //   two non-empty meshes that are merged.
      bHasTexturePackingDomain
        = bHasTextureCoordinates
        && m->m_packed_tex_domain[0].IsIncreasing()
        && m->m_packed_tex_domain[1].IsIncreasing();
      if (packed_tex_rotate != (m->m_packed_tex_rotate ? true : false))
      {
        if (0 == vcount0 && 0 == mi)
        {
          packed_tex_rotate = (m->m_packed_tex_rotate ? true : false);
        }
        else
        {
          bHasTexturePackingDomain = false;
        }
      }
      if (bHasTexturePackingDomain)
      {
        if (1 == merged_count)
        {
          packed_tex_rotate = (m->m_packed_tex_rotate ? true : false);
        }
        else if (packed_tex_rotate != (m->m_packed_tex_rotate ? true : false))
        {
          bHasTexturePackingDomain = false;
        }
        packed_tex_domain[0].Union(m->m_packed_tex_domain[0]);
        packed_tex_domain[1].Union(m->m_packed_tex_domain[1]);
      }
    }
  }


  if (vcount <= vcount0 && fcount <= fcount0)
    return;

  if (!bHasSurfaceParameters || !bHasSurfaceDomain)
  {
    srf_domain[0] = ON_Interval::EmptyInterval;
    srf_domain[1] = ON_Interval::EmptyInterval;
    srf_scale[0] = 0.0;
    srf_scale[1] = 0.0;
  }

  if (!bHasTextureCoordinates || !bHasTexturePackingDomain)
  {
    packed_tex_domain[0] = ON_Interval::EmptyInterval;
    packed_tex_domain[1] = ON_Interval::EmptyInterval;
    packed_tex_rotate = false;
  }

  m_srf_domain[0] = srf_domain[0];
  m_srf_domain[1] = srf_domain[1];
  m_srf_scale[0] = srf_scale[0];
  m_srf_scale[1] = srf_scale[1];

  m_packed_tex_domain[0] = packed_tex_domain[0];
  m_packed_tex_domain[1] = packed_tex_domain[1];
  m_packed_tex_rotate = packed_tex_rotate;

  m_top.Destroy();

  // It is critical to call DoublePrecisionVertices() before 
  // we modify m_V[] because DoublePrecisionVertices() will
  // attempt to update the double precision information
  // when it notices that m_V has new vertices added.

  m_V.Reserve(vcount);
  m_F.Reserve(fcount);
  for (mi = 0; mi < mesh_count; mi++)
  {
    const unsigned int vcount0_local = m_V.UnsignedCount();
    const unsigned int fcount0_local = m_F.UnsignedCount();
    m = meshes[mi];
    if (0 == m)
      continue;
    int vcount1 = m->m_V.Count();
    if (vcount1 <= 0)
      continue;
    int fcount1 = m->m_F.Count();
    if (fcount1 > 0)
    {
      j = m_F.Count();
      m_F.Append(fcount1, m->m_F.Array());
      fcount1 += j;
      while (j < fcount1)
      {
        vi = m_F[j].vi;
        vi[0] += (int)vcount0_local;
        vi[1] += (int)vcount0_local;
        vi[2] += (int)vcount0_local;
        vi[3] += (int)vcount0_local;
        j++;
      }
    }
    m_V.Append(vcount1, m->m_V.Array());
    if (m->HasNgons())
    {
      if (0 != m->NgonMap())
        bHasNgonMap = true;
      m_NgonMap.Destroy();
      unsigned int ngon_count = m->NgonUnsignedCount();
      for (unsigned int ni = 0; ni < ngon_count; ni++)
      {
        const ON_MeshNgon* ngon0 = m->Ngon(ni);
        if (0 == ngon0)
          continue;
        if (0 == ngon0->m_Vcount && 0 == ngon0->m_Fcount)
          continue;
        ON_MeshNgon* ngon1 = this->m_NgonAllocator.CopyNgon(ngon0);
        if (0 == ngon1)
          continue;
        for (unsigned int nvi = 0; nvi < ngon1->m_Vcount; nvi++)
        {
          ngon1->m_vi[nvi] += vcount0_local;
        }
        for (unsigned int nfi = 0; nfi < ngon1->m_Fcount; nfi++)
        {
          ngon1->m_fi[nfi] += fcount0_local;
        }
        this->AddNgon(ngon1);
      }
    }
  }

  if (bHasDoubles)
  {
    // Now update the double precision vertex locations.
    m_dV.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m || m->m_dV.Count() <= 0)
        continue;
      m_dV.Append(m->m_dV.Count(), m->m_dV.Array());
    }
    if (m_dV.Count() != vcount)
      bHasDoubles = false;
  }

  if (false == bHasDoubles)
  {
    bHasDoubles = false;
    DestroyDoublePrecisionVertices();
  }

  if (bHasVertexNormals)
  {
    m_N.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_N.Append(m->m_N.Count(), m->m_N.Array());
    }
  }
  else
  {
    m_N.Destroy();
  }


  if (bHasFaceNormals)
  {
    m_FN.Reserve(fcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m || m->m_V.Count() <= 0)
        continue;
      m_FN.Append(m->m_FN.Count(), m->m_FN.Array());
    }
  }
  else
  {
    m_FN.Destroy();
  }

  if (bHasTextureCoordinates)
  {
    m_T.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_T.Append(m->m_T.Count(), m->m_T.Array());
    }
  }
  else
  {
    m_T.Destroy();
  }


  if (bHasSurfaceParameters)
  {
    m_S.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_S.Append(m->m_S.Count(), m->m_S.Array());
    }
  }
  else
  {
    m_S.Destroy();
  }

  if (bHasPrincipalCurvatures)
  {
    m_K.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_K.Append(m->m_K.Count(), m->m_K.Array());
    }
  }
  else
  {
    m_K.Destroy();
  }

  if (bHasVertexColors)
  {
    m_C.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_C.Append(m->m_C.Count(), m->m_C.Array());
    }
  }
  else
  {
    m_C.Destroy();
  }

  if (0 != m_mesh_parameters)
  {
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      if (0 == m->m_mesh_parameters || *m_mesh_parameters != *m->m_mesh_parameters)
      {
        delete m_mesh_parameters;
        m_mesh_parameters = 0;
        break;
      }
    }
  }

  for (j = 0; j < 4; j++)
  {
    if (m_kstat[j])
    {
      // will be recomputed if required
      delete m_kstat[j];
      m_kstat[j] = 0;
    }
  }

  bool bAllowNewCachedTCs = (vcount0 == 0);
  for (mi = 0; mi < mesh_count; mi++)
  {
    m = meshes[mi];
    if (0 == m)
      continue;

    if (bAllowNewCachedTCs)
    {
      m_TC = m->m_TC;
      bAllowNewCachedTCs = false;
    }
    else
    {
      for (int tci = 0; tci < m_TC.Count(); tci++)
      {
        bool bKeep = false;
        for (int tcimi = 0; tcimi < m->m_TC.Count(); tcimi++)
        {
          if (m_TC[tci].m_tag == m->m_TC[tcimi].m_tag)
          {
            m_TC[tci].m_T.Append(m->m_TC[tcimi].m_T.Count(), m->m_TC[tcimi].m_T.Array());
            bKeep = true;
          }
        }
        if (!bKeep)
        {
          m_TC.Remove(tci);
          tci--;
        }
      }
    }
  }

  SetClosed(-99);
  SetSolidOrientation(-99);
  InvalidateBoundingBoxes();

  if (NgonCount() > 0 && bHasNgonMap)
    CreateNgonMap();

  if (bSetMeshParameters && nullptr != mp && mp != this->MeshParameters())
  {
    // Appending to an empty this and all appendees have matching mesh parameters.
    this->SetMeshParameters(*mp);
  }
}